

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

MemorySize * __thiscall wasm::Builder::makeMemorySize(Builder *this,Name memoryName,MemoryInfo info)

{
  bool bVar1;
  MemorySize *this_00;
  
  this_00 = MixedArena::alloc<wasm::MemorySize>(&this->wasm->allocator);
  bVar1 = isMemory64(this,memoryName,info);
  if (bVar1) {
    MemorySize::make64(this_00);
  }
  (this_00->memory).super_IString.str._M_len = memoryName.super_IString.str._M_len;
  (this_00->memory).super_IString.str._M_str = memoryName.super_IString.str._M_str;
  MemorySize::finalize(this_00);
  return this_00;
}

Assistant:

MemorySize* makeMemorySize(Name memoryName,
                             MemoryInfo info = MemoryInfo::Unspecified) {
    auto* ret = wasm.allocator.alloc<MemorySize>();
    if (isMemory64(memoryName, info)) {
      ret->make64();
    }
    ret->memory = memoryName;
    ret->finalize();
    return ret;
  }